

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.hpp
# Opt level: O2

Color plot::operator-(Color *lhs,Color *rhs)

{
  Color CVar1;
  
  CVar1.r = lhs->r - rhs->r;
  CVar1.g = lhs->g - rhs->g;
  CVar1.a = lhs->a - rhs->a;
  CVar1.b = lhs->b - rhs->b;
  return CVar1;
}

Assistant:

inline constexpr Color operator-(Color const& lhs, Color const& rhs) {
    return {
        lhs.r - rhs.r,
        lhs.g - rhs.g,
        lhs.b - rhs.b,
        lhs.a - rhs.a
    };
}